

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O3

bool __thiscall
TcpServer::notifyChangeEpoll
          (TcpServer *this,
          vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
          *changes)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  __first;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  __last;
  _Base_ptr p_Var3;
  bool bVar4;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  _Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
  *__range1;
  const_iterator local_60;
  iterator local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  __first._M_current =
       (changes->
       super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (changes->
       super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    p_Var3 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
LAB_00108002:
      bVar4 = false;
      goto LAB_00108005;
    }
    p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
    _Var5._M_current = __first._M_current;
    do {
      iVar2 = (_Var5._M_current)->first;
      p_Var6 = &p_Var1->_M_header;
      p_Var7 = p_Var3;
      do {
        if (iVar2 <= (int)p_Var7[1]._M_color) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar2];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 == p_Var1) || (iVar2 < (int)p_Var6[1]._M_color))
      goto LAB_00108002;
      _Var5._M_current = _Var5._M_current + 1;
    } while (_Var5._M_current != __last._M_current);
  }
  local_60._M_cur =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_60._M_first =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_60._M_last =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_60._M_node =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>::
  insert<__gnu_cxx::__normal_iterator<std::pair<int,EpollChangeOperation>const*,std::vector<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>>,void>
            (&local_40,
             (deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
              *)&this->changesTempStorage,&local_60,__first,__last);
  bVar4 = writePipeToNotify(this,'c');
LAB_00108005:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return bVar4;
}

Assistant:

bool notifyChangeEpoll(
      const std::vector<std::pair<int, EpollChangeOperation>> &changes) {
    AutoMutex m(mutex);
    for (auto c : changes) {
      if (!isVaildConnection(c.first)) {
        return false;
      }
    }
    changesTempStorage.insert(changesTempStorage.end(), changes.begin(),
                              changes.end());
    return writePipeToNotify('c');
  }